

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRotUtils.h
# Opt level: O2

ChMatrix33<double> *
chrono::fea::rotutils::Elle
          (ChMatrix33<double> *__return_storage_ptr__,ChVector<double> *phi,ChVector<double> *a)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ChVector<double> v;
  double coeff [5];
  ChVector<double> local_1d8;
  ChVector<double> local_1b8;
  double local_198;
  double dStack_190;
  double local_188;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  ChStarMatrix33<double> local_150;
  ChStarMatrix33<double> local_108;
  double local_c0;
  double local_b8;
  double dStack_b0;
  double dStack_a8;
  double dStack_a0;
  undefined1 local_98 [16];
  double local_88;
  double local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  double local_60;
  undefined8 local_58;
  double local_50;
  double dStack_48;
  undefined8 local_40;
  undefined8 local_38;
  
  CoeffE<chrono::ChVector<double>,double>(phi,phi,&local_178);
  local_78 = 0;
  local_170 = -local_170;
  local_60 = a->m_data[2] * local_170;
  auVar10._0_8_ = -local_60;
  auVar10._8_8_ = 0x8000000000000000;
  local_70 = vmovlpd_avx(auVar10);
  local_58 = 0;
  auVar6._0_8_ = a->m_data[0] * local_170;
  auVar6._8_8_ = a->m_data[1] * local_170;
  local_50 = -auVar6._0_8_;
  dStack_48 = -auVar6._8_8_;
  local_68 = vmovhpd_avx(auVar6);
  local_40 = vmovlpd_avx(auVar6);
  local_38 = 0;
  local_1d8.m_data[0] = a->m_data[0] * local_168;
  local_1d8.m_data[1] = a->m_data[1] * local_168;
  local_1d8.m_data[2] = a->m_data[2] * local_168;
  ChStarMatrix33<double>::ChStarMatrix33(&local_108,phi,&local_1d8);
  local_1b8.m_data[0] = local_168 * a->m_data[0];
  local_1b8.m_data[1] = local_168 * a->m_data[1];
  local_1b8.m_data[2] = local_168 * a->m_data[2];
  Vcross<double,double>(phi,&local_1b8);
  local_c0 = 0.0;
  auVar7._0_8_ = -local_188;
  auVar7._8_4_ = 0;
  auVar7._12_4_ = 0x80000000;
  local_b8 = (double)vmovlps_avx(auVar7);
  dStack_a8 = local_188;
  auVar2._8_8_ = dStack_190;
  auVar2._0_8_ = local_198;
  dStack_a0 = 0.0;
  dStack_b0 = dStack_190;
  local_98._0_8_ = -local_198;
  local_98._8_4_ = SUB84(dStack_190,0);
  local_98._12_4_ = (uint)((ulong)dStack_190 >> 0x20) ^ 0x80000000;
  local_88 = (double)vmovlps_avx(auVar2);
  local_80 = 0.0;
  local_150.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_108;
  local_150.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&local_c0;
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator-=
            ((MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_78,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
              *)&local_150);
  Vcross<double,double>(phi,a);
  local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_160 * phi->m_data[2];
  local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
       dStack_190;
  auVar3 = vpermpd_avx2(ZEXT1632(CONCAT88(dStack_190,local_198)),0x50);
  local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_160 * phi->m_data[0];
  local_160 = local_160 * phi->m_data[1];
  local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
       local_198;
  auVar4 = vpermpd_avx2(ZEXT1632(CONCAT88(local_160,
                                          local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                          .m_storage.m_data.array[6])),0xc5);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar2 = vunpcklpd_avx(auVar4._0_16_,auVar8);
  auVar4 = vblendpd_avx(auVar4,ZEXT1632(auVar2),3);
  auVar4 = vpermpd_avx2(auVar4,0x24);
  local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar4._0_8_ * auVar3._0_8_;
  local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar4._8_8_ * auVar3._8_8_;
  local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       auVar4._16_8_ * auVar3._16_8_;
  local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar4._24_8_ * auVar3._24_8_;
  local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
       local_188;
  local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_160 * local_188;
  local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
       local_188;
  ChStarMatrix33<double>::ChStarMatrix33(&local_150,phi,phi);
  ChStarMatrix33<double>::operator*(&local_150,a);
  local_1d8.m_data[0] = (double)&local_108;
  dVar1 = local_158 * phi->m_data[2];
  auVar3 = vpermpd_avx2(ZEXT1632(CONCAT88(local_1b8.m_data[1],local_1b8.m_data[0])),0x50);
  dVar5 = local_158 * phi->m_data[0];
  local_158 = local_158 * phi->m_data[1];
  local_c0 = dVar5 * local_1b8.m_data[0];
  auVar4 = vpermpd_avx2(ZEXT1632(CONCAT88(local_158,dVar5)),0xc5);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar1;
  auVar2 = vunpcklpd_avx(auVar4._0_16_,auVar9);
  auVar4 = vblendpd_avx(auVar4,ZEXT1632(auVar2),3);
  auVar4 = vpermpd_avx2(auVar4,0x24);
  local_b8 = auVar4._0_8_ * auVar3._0_8_;
  dStack_b0 = auVar4._8_8_ * auVar3._8_8_;
  dStack_a8 = auVar4._16_8_ * auVar3._16_8_;
  dStack_a0 = auVar4._24_8_ * auVar3._24_8_;
  local_88 = local_158 * local_1b8.m_data[2];
  local_80 = dVar1 * local_1b8.m_data[2];
  local_98._8_8_ = dVar5 * local_1b8.m_data[2];
  local_98._0_8_ = dVar1 * local_1b8.m_data[1];
  local_1d8.m_data[1] = (double)&local_c0;
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_78,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
              *)&local_1d8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Matrix<double,3,3,1,3,3>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)__return_storage_ptr__,
             (DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

ChMatrix33<> Elle(const ChVector<>& phi, const ChVector<>& a) {
    double coeff[COEFF_E];
    CoeffE(phi, phi, coeff);

    ChStarMatrix33<> L(a * (-coeff[1]));
    L -= ChStarMatrix33<>(phi, a * coeff[2]) + ChStarMatrix33<>(Vcross(phi, a * coeff[2]));
    L += TensorProduct(Vcross(phi, a), phi * coeff[3]) + TensorProduct(ChStarMatrix33<>(phi, phi) * a, phi * coeff[4]);

    return L;
}